

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::showSystemMenu(QMdiSubWindow *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWidget *this_00;
  QPoint QVar4;
  Representation RVar5;
  QPoint QVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QPoint local_40;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x308));
  if (!bVar2) goto LAB_0041a804;
  this_00 = maximizedSystemMenuIconWidget(this);
  bVar2 = QWidget::isLeftToRight(&this->super_QWidget);
  if (this_00 == (QWidget *)0x0) {
    if (bVar2) {
      QVar7 = QWidget::contentsRect(&this->super_QWidget);
      local_40 = QVar7._0_8_;
      this_00 = &this->super_QWidget;
      goto LAB_0041a7af;
    }
    QVar7 = QWidget::contentsRect(&this->super_QWidget);
    local_40 = (QPoint)(QVar7._8_8_ & 0xffffffff | QVar7._0_8_ & 0xffffffff00000000);
    QVar4 = QWidget::mapToGlobal(&this->super_QWidget,&local_40);
    QVar6 = (QPoint)((long)QVar4 + 1);
    local_38 = (QPoint)((ulong)QVar6 & 0xffffffff | (ulong)QVar4 & 0xffffffff00000000);
  }
  else {
    if (bVar2) {
      iVar3 = QWidget::y(this_00);
      iVar3 = (iVar3 + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
      RVar5.m_i = 0;
    }
    else {
      RVar5.m_i = ((this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i) + 1;
      iVar3 = QWidget::y(this_00);
      iVar3 = (iVar3 + (this_00->data->crect).y2.m_i) - (this_00->data->crect).y1.m_i;
    }
    local_40.yp.m_i = iVar3 + 1;
    local_40.xp.m_i = RVar5.m_i;
LAB_0041a7af:
    local_38 = QWidget::mapToGlobal(this_00,&local_40);
    QVar6 = local_38;
  }
  bVar2 = QWidget::isRightToLeft(&this->super_QWidget);
  if (bVar2) {
    iVar3 = (**(code **)(**(long **)(lVar1 + 0x310) + 0x70))();
    local_38.xp.m_i = QVar6.xp.m_i.m_i - iVar3;
  }
  QMenu::popup(*(QMenu **)(lVar1 + 0x310),&local_38,(QAction *)0x0);
LAB_0041a804:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::showSystemMenu()
{
    Q_D(QMdiSubWindow);
    if (!d->systemMenu)
        return;

    QPoint globalPopupPos;
    if (QWidget *icon = maximizedSystemMenuIconWidget()) {
        if (isLeftToRight())
            globalPopupPos = icon->mapToGlobal(QPoint(0, icon->y() + icon->height()));
        else
            globalPopupPos = icon->mapToGlobal(QPoint(icon->width(), icon->y() + icon->height()));
    } else {
        if (isLeftToRight())
            globalPopupPos = mapToGlobal(contentsRect().topLeft());
        else // + QPoint(1, 0) because topRight() == QPoint(left() + width() -1, top())
            globalPopupPos = mapToGlobal(contentsRect().topRight()) + QPoint(1, 0);
    }

    // Adjust x() with -menuwidth in reverse mode.
    if (isRightToLeft())
        globalPopupPos -= QPoint(d->systemMenu->sizeHint().width(), 0);
    d->systemMenu->popup(globalPopupPos);
}